

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O0

CapabilitySet *
spvtools::val::anon_unknown_2::EnablingCapabilitiesForOp
          (CapabilitySet *__return_storage_ptr__,ValidationState_t *state,Op opcode)

{
  bool bVar1;
  spv_result_t sVar2;
  AssemblyGrammar *pAVar3;
  spv_opcode_desc local_28;
  spv_opcode_desc opcode_desc;
  ValidationState_t *pVStack_18;
  Op opcode_local;
  ValidationState_t *state_local;
  
  opcode_desc._4_4_ = opcode;
  pVStack_18 = state;
  state_local = (ValidationState_t *)__return_storage_ptr__;
  if ((opcode - OpGroupIAddNonUniformAMD < 8) &&
     (bVar1 = ValidationState_t::HasExtension(state,kSPV_AMD_shader_ballot), bVar1)) {
    EnumSet<spv::Capability>::EnumSet(__return_storage_ptr__);
  }
  else {
    local_28 = (spv_opcode_desc)0x0;
    pAVar3 = ValidationState_t::grammar(pVStack_18);
    sVar2 = AssemblyGrammar::lookupOpcode(pAVar3,opcode_desc._4_4_,&local_28);
    if (sVar2 == SPV_SUCCESS) {
      pAVar3 = ValidationState_t::grammar(pVStack_18);
      AssemblyGrammar::filterCapsAgainstTargetEnv
                (__return_storage_ptr__,pAVar3,local_28->capabilities,local_28->numCapabilities);
    }
    else {
      EnumSet<spv::Capability>::EnumSet(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CapabilitySet EnablingCapabilitiesForOp(const ValidationState_t& state,
                                        spv::Op opcode) {
  // Exceptions for SPV_AMD_shader_ballot
  switch (opcode) {
    // Normally these would require Group capability
    case spv::Op::OpGroupIAddNonUniformAMD:
    case spv::Op::OpGroupFAddNonUniformAMD:
    case spv::Op::OpGroupFMinNonUniformAMD:
    case spv::Op::OpGroupUMinNonUniformAMD:
    case spv::Op::OpGroupSMinNonUniformAMD:
    case spv::Op::OpGroupFMaxNonUniformAMD:
    case spv::Op::OpGroupUMaxNonUniformAMD:
    case spv::Op::OpGroupSMaxNonUniformAMD:
      if (state.HasExtension(kSPV_AMD_shader_ballot)) return CapabilitySet();
      break;
    default:
      break;
  }
  // Look it up in the grammar
  spv_opcode_desc opcode_desc = {};
  if (SPV_SUCCESS == state.grammar().lookupOpcode(opcode, &opcode_desc)) {
    return state.grammar().filterCapsAgainstTargetEnv(
        opcode_desc->capabilities, opcode_desc->numCapabilities);
  }
  return CapabilitySet();
}